

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O3

void blt(DLword *dest68k,DLword *source68k,int nw)

{
  DLword *pDVar1;
  DLword *pDVar2;
  
  if (nw != 0) {
    pDVar1 = source68k + nw;
    pDVar2 = dest68k + nw;
    do {
      pDVar2 = pDVar2 + -1;
      pDVar1 = pDVar1 + -1;
      *(undefined2 *)((ulong)pDVar2 ^ 2) = *(undefined2 *)((ulong)pDVar1 ^ 2);
      nw = nw + -1;
    } while (nw != 0);
  }
  return;
}

Assistant:

void blt(DLword *dest68k, DLword *source68k, int nw) {
  /******* OLD def ,
   Due to C compiler's bug, we can't use pre-decrement for val
    source68k += nw;
    dest68k += nw;
    while(nw)
    {
      GETWORD(--dest68k)= GETWORD(--source68k);
      nw--;
     }
  **** OLD def ****/
  source68k = source68k + nw - 1;
  dest68k = dest68k + nw - 1;
  while (nw--) { GETWORD(dest68k--) = GETWORD(source68k--); }
}